

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

void __thiscall
ser::Serializer::ReadField
          (Serializer *this,string *fieldName,Savepoint *savepoint,void *pData,int iStride,
          int jStride,int kStride,int lStride,bool alsoPrevious)

{
  ostringstream *this_00;
  void *data;
  Savepoint *pSVar1;
  int iVar2;
  int isize;
  int jsize;
  int ksize;
  int lsize;
  StellaOutputProxy *pSVar3;
  DataFieldInfo *this_01;
  ostream *poVar4;
  SerializationException *pSVar5;
  type pFVar6;
  vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *this_02;
  const_reference pvVar7;
  char *pcVar8;
  allocator_type local_681;
  undefined1 local_680 [8];
  vector<char,_std::allocator<char>_> binaryData;
  ifstream fs;
  undefined1 local_460 [8];
  string local_458;
  undefined1 local_438 [8];
  SerializationException exception_1;
  ostringstream errorstr_1;
  SerializationException *anon_var_0;
  bool found;
  offset_t offset;
  undefined1 local_260 [8];
  SerializationException exception;
  ostringstream local_218 [8];
  ostringstream errorstr;
  int savepointID;
  DataFieldInfo *info;
  string local_80;
  StellaOutput local_60;
  int local_50;
  int iStack_4c;
  bool alsoPrevious_local;
  int jStride_local;
  int iStride_local;
  void *pData_local;
  Savepoint *savepoint_local;
  string *fieldName_local;
  Serializer *this_local;
  
  local_60.maxlevel_._3_1_ = alsoPrevious;
  if (-1 < enabled_) {
    local_50 = jStride;
    iStack_4c = iStride;
    _jStride_local = pData;
    pData_local = savepoint;
    savepoint_local = (Savepoint *)fieldName;
    fieldName_local = (string *)this;
    stella::detail::StellaOutput::operator<<(&local_60,(char (*) [17])&sout);
    pSVar3 = stella::detail::StellaOutputProxy::operator<<
                       ((StellaOutputProxy *)&local_60,&savepoint_local->name_);
    pSVar3 = stella::detail::StellaOutputProxy::operator<<(pSVar3,(char (*) [15])0x1fa356);
    Savepoint::ToString_abi_cxx11_(&local_80,(Savepoint *)pData_local);
    pSVar3 = stella::detail::StellaOutputProxy::operator<<(pSVar3,&local_80);
    pSVar3 = stella::detail::StellaOutputProxy::operator<<(pSVar3,(char (*) [15])" into data at ");
    pSVar3 = stella::detail::StellaOutputProxy::operator<<(pSVar3,(void **)&jStride_local);
    stella::detail::StellaOutputProxy::operator<<(pSVar3,(char (*) [2])0x1f84dc);
    std::__cxx11::string::~string((string *)&local_80);
    this_01 = FieldsTable::Find(&this->fieldsTable_,&savepoint_local->name_);
    iVar2 = OffsetTable::GetSavepointID(&this->offsetTable_,(Savepoint *)pData_local);
    if (iVar2 < 0) {
      std::__cxx11::ostringstream::ostringstream(local_218);
      poVar4 = std::operator<<((ostream *)local_218,"Error: the requested savepoint ");
      Savepoint::ToString_abi_cxx11_
                ((string *)((long)&exception.message_.field_2 + 8),(Savepoint *)pData_local);
      poVar4 = std::operator<<(poVar4,(string *)(exception.message_.field_2._M_local_buf + 8));
      std::operator<<(poVar4," does not exist in the serializer.");
      std::__cxx11::string::~string((string *)(exception.message_.field_2._M_local_buf + 8));
      SerializationException::SerializationException((SerializationException *)local_260);
      std::__cxx11::ostringstream::str();
      SerializationException::Init((SerializationException *)local_260,(string *)&offset);
      std::__cxx11::string::~string((string *)&offset);
      pSVar5 = (SerializationException *)__cxa_allocate_exception(0x28);
      SerializationException::SerializationException(pSVar5,(SerializationException *)local_260);
      __cxa_throw(pSVar5,&SerializationException::typeinfo,
                  SerializationException::~SerializationException);
    }
    if ((local_60.maxlevel_._3_1_ & 1) != 0) {
      OffsetTable::GetOffset(&this->offsetTable_,iVar2,&savepoint_local->name_);
      if (iVar2 < 0) {
        this_00 = (ostringstream *)(exception_1.message_.field_2._M_local_buf + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        poVar4 = std::operator<<((ostream *)this_00,"Error: field ");
        poVar4 = std::operator<<(poVar4,(string *)savepoint_local);
        poVar4 = std::operator<<(poVar4," is never serialized ");
        poVar4 = std::operator<<(poVar4,"at or before savepoint ");
        poVar4 = ser::operator<<(poVar4,(Savepoint *)pData_local);
        std::operator<<(poVar4,"\n");
        SerializationException::SerializationException((SerializationException *)local_438);
        std::__cxx11::ostringstream::str();
        SerializationException::Init((SerializationException *)local_438,(string *)(local_460 + 8));
        std::__cxx11::string::~string((string *)(local_460 + 8));
        pSVar5 = (SerializationException *)__cxa_allocate_exception(0x28);
        SerializationException::SerializationException(pSVar5,(SerializationException *)local_438);
        __cxa_throw(pSVar5,&SerializationException::typeinfo,
                    SerializationException::~SerializationException);
      }
      stella::detail::StellaOutput::operator<<((StellaOutput *)local_460,(char (*) [26])&sout);
      pSVar3 = stella::detail::StellaOutputProxy::operator<<
                         ((StellaOutputProxy *)local_460,(Savepoint *)pData_local);
      stella::detail::StellaOutputProxy::operator<<(pSVar3,(char (*) [2])0x1f84dc);
    }
    std::ifstream::ifstream
              (&binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    pFVar6 = boost::shared_ptr<ser::FileFormat>::operator->(&this->pFileFormat_);
    pSVar1 = savepoint_local;
    this_02 = OffsetTable::savepoints(&this->offsetTable_);
    pvVar7 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                       (this_02,(long)iVar2);
    (*pFVar6->_vptr_FileFormat[7])
              (pFVar6,&binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
               ,pSVar1,pvVar7);
    iVar2 = DataFieldInfo::dataSize(this_01);
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_680,(long)iVar2,&local_681);
    std::allocator<char>::~allocator(&local_681);
    pcVar8 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_680);
    std::vector<char,_std::allocator<char>_>::size((vector<char,_std::allocator<char>_> *)local_680)
    ;
    std::istream::read(&binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        field_0x10,(long)pcVar8);
    data = _jStride_local;
    iVar2 = DataFieldInfo::bytesPerElement(this_01);
    isize = DataFieldInfo::iSize(this_01);
    jsize = DataFieldInfo::jSize(this_01);
    ksize = DataFieldInfo::kSize(this_01);
    lsize = DataFieldInfo::lSize(this_01);
    BinarySerializer::ReadArray
              (&this->binarySerializer_,data,iVar2,isize,jsize,ksize,lsize,iStack_4c,local_50,
               kStride,lStride,(vector<char,_std::allocator<char>_> *)local_680);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_680);
    std::ifstream::~ifstream
              (&binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  }
  return;
}

Assistant:

void Serializer::ReadField(const std::string& fieldName, const Savepoint& savepoint,
        void* pData, int iStride, int jStride, int kStride, int lStride, bool alsoPrevious) const
{
    // Don't read if serialization is disabeld
    if (enabled_ < 0) return;

    sout << "Requested field " << fieldName << " at savepoint " << savepoint.ToString()
         << " into data at " << pData << "\n";

    // Retrieve field info
    // (It will throw an exception is the field is not yet registered)
    const DataFieldInfo& info = fieldsTable_.Find(fieldName);

    // Search savepoint
    int savepointID = offsetTable_.GetSavepointID(savepoint);
    if (savepointID < 0)
    {
        // Throw exception
        std::ostringstream errorstr;
        errorstr << "Error: the requested savepoint " << savepoint.ToString()
            << " does not exist in the serializer.";
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    // Search in previous savepoints
    if (alsoPrevious)
    {
        OffsetTable::offset_t offset;
        bool found = false;
        while(!found)
        {
            try
            {
                offsetTable_.GetOffset(savepointID, fieldName);

                // Field is found
                found = true;
                break;
            }
            catch (SerializationException&)
            {
                // Field is not found: proceed with previous savepoint
            }

            if(--savepointID < 0)
                break;
        }

        if (savepointID < 0)
        {
            std::ostringstream errorstr;
            errorstr << "Error: field " << fieldName << " is never serialized "
                     << "at or before savepoint " << savepoint << "\n";
            SerializationException exception;
            exception.Init(errorstr.str());
            throw exception;
        }

        sout << "Field found at savepoint " << savepoint << "\n";
    }

    // Open file stream
    // (This will check if the field is saved at savepoint and throw otherwise)
    std::ifstream fs;
    pFileFormat_->OpenStreamRead(fs, fieldName, offsetTable_.savepoints()[savepointID]);

    // Read data into buffer
    std::vector<char> binaryData(info.dataSize());
    fs.read(binaryData.data(), binaryData.size());

    // Read data into array
    binarySerializer_.ReadArray(pData, info.bytesPerElement(),
            info.iSize(), info.jSize(), info.kSize(), info.lSize(),
            iStride, jStride, kStride, lStride, binaryData);
}